

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

void __thiscall
icu_63::CollationData::makeReorderRanges
          (CollationData *this,int32_t *reorder,int32_t length,UBool latinMustMove,UVector32 *ranges
          ,UErrorCode *errorCode)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  bool bVar4;
  UBool UVar5;
  uint uVar6;
  int iVar7;
  int32_t iVar8;
  ushort uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  bool bVar20;
  uint8_t table [256];
  byte local_138 [264];
  
  if (((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
      (UVector32::removeAllElements(ranges), length != 0)) && ((length != 1 || (*reorder != 0x67))))
  {
    memset(local_138,0,0x100);
    puVar2 = this->scriptsIndex;
    iVar7 = this->numScripts;
    if ((ulong)puVar2[(long)iVar7 + 0xe] != 0) {
      local_138[puVar2[(long)iVar7 + 0xe]] = 0xff;
    }
    if ((ulong)puVar2[(long)iVar7 + 0xf] != 0) {
      local_138[puVar2[(long)iVar7 + 0xf]] = 0xff;
    }
    puVar3 = this->scriptStarts;
    iVar18 = this->scriptStartsLength;
    if (length < 1) {
      uVar10 = 0;
    }
    else {
      uVar14 = 0;
      uVar10 = 0;
      do {
        uVar16 = 1 << ((byte)reorder[uVar14] & 0x1f);
        if ((reorder[uVar14] & 0xfffffff8U) != 0x1000) {
          uVar16 = 0;
        }
        uVar10 = uVar10 | uVar16;
        uVar14 = uVar14 + 1;
      } while ((uint)length != uVar14);
    }
    uVar16 = (uint)puVar3[1];
    uVar6 = (uint)puVar3[(long)iVar18 + -1];
    lVar15 = 0;
    do {
      uVar14 = (ulong)puVar2[iVar7 + lVar15];
      if ((uVar14 != 0) && ((uVar10 >> ((uint)lVar15 & 0x1f) & 1) == 0)) {
        uVar9 = puVar3[uVar14];
        uVar19 = uVar16 + 0x100;
        if ((uVar16 & 0xff) <= (uVar9 & 0xff)) {
          uVar19 = uVar16;
        }
        local_138[uVar14] = (byte)(uVar19 >> 8);
        uVar16 = (puVar3[uVar14 + 1] & 0xff | (puVar3[uVar14 + 1] & 0xff00) - (uVar9 & 0xff00)) +
                 (uVar19 & 0xff00);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 != 8);
    uVar19 = 0;
    if (((uVar10 == 0) && (uVar19 = 0, latinMustMove == '\0')) && (*reorder == 0x19)) {
      uVar19 = puVar3[puVar2[0x19]] - uVar16 & 0xff00;
      uVar16 = (uint)puVar3[puVar2[0x19]];
    }
    if (length < 1) {
      bVar4 = true;
      bVar20 = true;
    }
    else {
      iVar17 = 1;
      lVar15 = 0;
      bVar4 = false;
      iVar8 = length;
      do {
        uVar10 = reorder[lVar15];
        uVar14 = (ulong)uVar10;
        lVar15 = lVar15 + 1;
        if (uVar14 == 0xffffffff) {
LAB_0023c1f9:
          *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
          iVar11 = 1;
        }
        else if (uVar10 == 0x67) {
          lVar12 = (long)iVar8;
          bVar4 = true;
          if (lVar15 < lVar12) {
            do {
              iVar8 = iVar8 + -1;
              uVar10 = reorder[lVar12 + -1];
              uVar14 = (ulong)uVar10;
              if ((uVar14 == 0x67) || (uVar10 == 0xffffffff)) goto LAB_0023c1f9;
              if ((int)uVar10 < 0) {
LAB_0023c114:
                uVar9 = 0;
              }
              else {
                if (iVar7 <= (int)uVar10) {
                  if ((uVar10 & 0x7ffffff8) != 0x1000) goto LAB_0023c114;
                  uVar14 = (ulong)(int)(uVar10 + iVar7 + -0x1000);
                }
                uVar9 = puVar2[uVar14];
              }
              if (uVar9 == 0) {
                iVar11 = 10;
              }
              else if (local_138[uVar9] == 0) {
                uVar10 = uVar6 + 0xff00;
                if ((puVar3[(ulong)uVar9 + 1] & 0xff) <= (uVar6 & 0xff)) {
                  uVar10 = uVar6;
                }
                uVar10 = ((puVar3[uVar9] & 0xff00) - (puVar3[(ulong)uVar9 + 1] & 0xff00)) +
                         (uVar10 & 0xff00);
                uVar6 = puVar3[uVar9] & 0xff | uVar10;
                local_138[uVar9] = (byte)(uVar10 >> 8);
                iVar11 = 0;
              }
              else {
                *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                iVar11 = 1;
              }
              if ((iVar11 != 10) && (iVar11 != 0)) goto LAB_0023c265;
              lVar12 = lVar12 + -1;
            } while (lVar15 < lVar12);
            iVar11 = 8;
            iVar8 = iVar17;
          }
          else {
            iVar11 = 8;
          }
        }
        else {
          if ((int)uVar10 < 0) {
LAB_0023c1e8:
            uVar9 = 0;
          }
          else {
            if (iVar7 <= (int)uVar10) {
              if ((uVar10 & 0x7ffffff8) != 0x1000) goto LAB_0023c1e8;
              uVar14 = (ulong)(int)(uVar10 + iVar7 + -0x1000);
            }
            uVar9 = puVar2[uVar14];
          }
          if (uVar9 == 0) {
            iVar11 = 9;
          }
          else {
            if (local_138[uVar9] != 0) goto LAB_0023c1f9;
            uVar1 = puVar3[uVar9];
            uVar10 = uVar16 + 0x100;
            if ((uVar16 & 0xff) <= (uVar1 & 0xff)) {
              uVar10 = uVar16;
            }
            local_138[uVar9] = (byte)(uVar10 >> 8);
            uVar16 = (puVar3[(ulong)uVar9 + 1] & 0xff |
                     (puVar3[(ulong)uVar9 + 1] & 0xff00) - (uVar1 & 0xff00)) + (uVar10 & 0xff00);
            iVar11 = 0;
          }
        }
LAB_0023c265:
        if ((iVar11 != 9) && (iVar11 != 0)) goto LAB_0023c282;
        iVar17 = iVar17 + 1;
      } while (lVar15 < iVar8);
      iVar11 = 8;
LAB_0023c282:
      bVar20 = iVar11 == 8;
      bVar4 = !bVar4;
    }
    if (bVar20) {
      if (2 < iVar18) {
        uVar14 = 1;
        do {
          if (local_138[uVar14] == 0) {
            uVar13 = (uint)puVar3[uVar14];
            uVar10 = uVar13;
            if ((int)(uint)puVar3[uVar14] < (int)uVar16) {
              uVar10 = uVar16;
            }
            if (!bVar4) {
              uVar10 = uVar16;
            }
            uVar16 = uVar10 + 0x100;
            if ((uVar10 & 0xff) <= (uVar13 & 0xff)) {
              uVar16 = uVar10;
            }
            local_138[uVar14] = (byte)(uVar16 >> 8);
            uVar16 = (puVar3[uVar14 + 1] & 0xff | (puVar3[uVar14 + 1] & 0xff00) - (uVar13 & 0xff00))
                     + (uVar16 & 0xff00);
          }
          uVar14 = uVar14 + 1;
        } while (iVar18 - 1 != uVar14);
      }
      if ((int)uVar6 < (int)uVar16) {
        if ((int)uVar6 < (int)(uVar16 - uVar19)) {
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
        }
        else {
          makeReorderRanges(this,reorder,length,'\x01',ranges,errorCode);
        }
      }
      else {
        iVar7 = 1;
        uVar10 = 0;
        do {
          iVar17 = this->scriptStartsLength + -1;
          iVar18 = iVar7;
          uVar16 = uVar10;
          do {
            if (iVar17 <= iVar18) break;
            if ((local_138[iVar18] == 0xff) ||
               (uVar16 = (uint)local_138[iVar18] -
                         (uint)*(byte *)((long)this->scriptStarts + (long)iVar18 * 2 + 1),
               uVar16 == uVar10)) {
              iVar18 = iVar18 + 1;
              bVar20 = true;
            }
            else {
              bVar20 = false;
            }
          } while (bVar20);
          if ((uVar10 != 0) || (iVar18 < iVar17)) {
            uVar9 = this->scriptStarts[iVar18];
            iVar7 = ranges->count;
            if (((-2 < iVar7) && (iVar7 < ranges->capacity)) ||
               (UVar5 = UVector32::expandCapacity(ranges,iVar7 + 1,errorCode), UVar5 != '\0')) {
              ranges->elements[ranges->count] = uVar10 & 0xffff | (uint)uVar9 << 0x10;
              ranges->count = ranges->count + 1;
            }
          }
          iVar7 = iVar18 + 1;
          uVar10 = uVar16;
        } while (iVar18 != this->scriptStartsLength + -1);
      }
    }
  }
  return;
}

Assistant:

void
CollationData::makeReorderRanges(const int32_t *reorder, int32_t length,
                                 UBool latinMustMove,
                                 UVector32 &ranges, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return; }
    ranges.removeAllElements();
    if(length == 0 || (length == 1 && reorder[0] == USCRIPT_UNKNOWN)) {
        return;
    }

    // Maps each script-or-group range to a new lead byte.
    uint8_t table[MAX_NUM_SCRIPT_RANGES];
    uprv_memset(table, 0, sizeof(table));

    {
        // Set "don't care" values for reserved ranges.
        int32_t index = scriptsIndex[
                numScripts + REORDER_RESERVED_BEFORE_LATIN - UCOL_REORDER_CODE_FIRST];
        if(index != 0) {
            table[index] = 0xff;
        }
        index = scriptsIndex[
                numScripts + REORDER_RESERVED_AFTER_LATIN - UCOL_REORDER_CODE_FIRST];
        if(index != 0) {
            table[index] = 0xff;
        }
    }

    // Never reorder special low and high primary lead bytes.
    U_ASSERT(scriptStartsLength >= 2);
    U_ASSERT(scriptStarts[0] == 0);
    int32_t lowStart = scriptStarts[1];
    U_ASSERT(lowStart == ((Collation::MERGE_SEPARATOR_BYTE + 1) << 8));
    int32_t highLimit = scriptStarts[scriptStartsLength - 1];
    U_ASSERT(highLimit == (Collation::TRAIL_WEIGHT_BYTE << 8));

    // Get the set of special reorder codes in the input list.
    // This supports a fixed number of special reorder codes;
    // it works for data with codes beyond UCOL_REORDER_CODE_LIMIT.
    uint32_t specials = 0;
    for(int32_t i = 0; i < length; ++i) {
        int32_t reorderCode = reorder[i] - UCOL_REORDER_CODE_FIRST;
        if(0 <= reorderCode && reorderCode < MAX_NUM_SPECIAL_REORDER_CODES) {
            specials |= (uint32_t)1 << reorderCode;
        }
    }

    // Start the reordering with the special low reorder codes that do not occur in the input.
    for(int32_t i = 0; i < MAX_NUM_SPECIAL_REORDER_CODES; ++i) {
        int32_t index = scriptsIndex[numScripts + i];
        if(index != 0 && (specials & ((uint32_t)1 << i)) == 0) {
            lowStart = addLowScriptRange(table, index, lowStart);
        }
    }

    // Skip the reserved range before Latin if Latin is the first script,
    // so that we do not move it unnecessarily.
    int32_t skippedReserved = 0;
    if(specials == 0 && reorder[0] == USCRIPT_LATIN && !latinMustMove) {
        int32_t index = scriptsIndex[USCRIPT_LATIN];
        U_ASSERT(index != 0);
        int32_t start = scriptStarts[index];
        U_ASSERT(lowStart <= start);
        skippedReserved = start - lowStart;
        lowStart = start;
    }

    // Reorder according to the input scripts, continuing from the bottom of the primary range.
    int32_t originalLength = length;  // length will be decremented if "others" is in the list.
    UBool hasReorderToEnd = FALSE;
    for(int32_t i = 0; i < length;) {
        int32_t script = reorder[i++];
        if(script == USCRIPT_UNKNOWN) {
            // Put the remaining scripts at the top.
            hasReorderToEnd = TRUE;
            while(i < length) {
                script = reorder[--length];
                if(script == USCRIPT_UNKNOWN ||  // Must occur at most once.
                        script == UCOL_REORDER_CODE_DEFAULT) {
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return;
                }
                int32_t index = getScriptIndex(script);
                if(index == 0) { continue; }
                if(table[index] != 0) {  // Duplicate or equivalent script.
                    errorCode = U_ILLEGAL_ARGUMENT_ERROR;
                    return;
                }
                highLimit = addHighScriptRange(table, index, highLimit);
            }
            break;
        }
        if(script == UCOL_REORDER_CODE_DEFAULT) {
            // The default code must be the only one in the list, and that is handled by the caller.
            // Otherwise it must not be used.
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        int32_t index = getScriptIndex(script);
        if(index == 0) { continue; }
        if(table[index] != 0) {  // Duplicate or equivalent script.
            errorCode = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }
        lowStart = addLowScriptRange(table, index, lowStart);
    }

    // Put all remaining scripts into the middle.
    for(int32_t i = 1; i < scriptStartsLength - 1; ++i) {
        int32_t leadByte = table[i];
        if(leadByte != 0) { continue; }
        int32_t start = scriptStarts[i];
        if(!hasReorderToEnd && start > lowStart) {
            // No need to move this script.
            lowStart = start;
        }
        lowStart = addLowScriptRange(table, i, lowStart);
    }
    if(lowStart > highLimit) {
        if((lowStart - (skippedReserved & 0xff00)) <= highLimit) {
            // Try not skipping the before-Latin reserved range.
            makeReorderRanges(reorder, originalLength, TRUE, ranges, errorCode);
            return;
        }
        // We need more primary lead bytes than available, despite the reserved ranges.
        errorCode = U_BUFFER_OVERFLOW_ERROR;
        return;
    }

    // Turn lead bytes into a list of (limit, offset) pairs.
    // Encode each pair in one list element:
    // Upper 16 bits = limit, lower 16 = signed lead byte offset.
    int32_t offset = 0;
    for(int32_t i = 1;; ++i) {
        int32_t nextOffset = offset;
        while(i < scriptStartsLength - 1) {
            int32_t newLeadByte = table[i];
            if(newLeadByte == 0xff) {
                // "Don't care" lead byte for reserved range, continue with current offset.
            } else {
                nextOffset = newLeadByte - (scriptStarts[i] >> 8);
                if(nextOffset != offset) { break; }
            }
            ++i;
        }
        if(offset != 0 || i < scriptStartsLength - 1) {
            ranges.addElement(((int32_t)scriptStarts[i] << 16) | (offset & 0xffff), errorCode);
        }
        if(i == scriptStartsLength - 1) { break; }
        offset = nextOffset;
    }
}